

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  ushort uVar1;
  uint uVar2;
  void *pvVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  WirePointer *pWVar6;
  StructPointerCount SVar7;
  undefined2 uVar8;
  undefined4 uVar9;
  Which WVar10;
  PointerType PVar11;
  uint uVar12;
  int iVar13;
  ArrayPtr<const_char> AVar14;
  DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
  _kjCondition;
  Fault f;
  undefined1 local_98 [24];
  int iStack_80;
  undefined4 uStack_7c;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  int iStack_70;
  undefined4 uStack_6c;
  SegmentReader *local_68;
  WirePointer *local_60;
  CapTableReader *local_58;
  PointerReader local_50;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  if ((decl->_reader).pointerCount == 0) {
    local_50.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
    local_50.nestingLimit = 0x7fffffff;
  }
  else {
    local_50.segment = (decl->_reader).segment;
    local_50.capTable = (decl->_reader).capTable;
    local_50.pointer = (decl->_reader).pointers;
    local_50.nestingLimit = (decl->_reader).nestingLimit;
  }
  capnp::_::PointerReader::getStruct((StructReader *)local_98,&local_50,(word *)0x0);
  local_50.pointer = (WirePointer *)0x0;
  local_50.segment = (SegmentReader *)0x0;
  local_50.capTable = (CapTableReader *)0x0;
  local_50.nestingLimit = 0x7fffffff;
  if (SStack_74 != 0) {
    local_50.pointer = (WirePointer *)CONCAT44(uStack_7c,iStack_80);
    local_50.segment = (SegmentReader *)local_98._0_8_;
    local_50.capTable = (CapTableReader *)local_98._8_8_;
    local_50.nestingLimit = iStack_70;
  }
  uVar12 = 0;
  AVar14 = (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
  (this->name).content = AVar14;
  pSVar4 = (decl->_reader).segment;
  pCVar5 = (decl->_reader).capTable;
  pvVar3 = (decl->_reader).data;
  pWVar6 = (decl->_reader).pointers;
  SVar7 = (decl->_reader).pointerCount;
  uVar8 = *(undefined2 *)&(decl->_reader).field_0x26;
  iVar13 = (decl->_reader).nestingLimit;
  uVar9 = *(undefined4 *)&(decl->_reader).field_0x2c;
  (this->declId)._reader.dataSize = (decl->_reader).dataSize;
  (this->declId)._reader.pointerCount = SVar7;
  *(undefined2 *)&(this->declId)._reader.field_0x26 = uVar8;
  (this->declId)._reader.nestingLimit = iVar13;
  *(undefined4 *)&(this->declId)._reader.field_0x2c = uVar9;
  (this->declId)._reader.data = pvVar3;
  (this->declId)._reader.pointers = pWVar6;
  (this->declId)._reader.segment = pSVar4;
  (this->declId)._reader.capTable = pCVar5;
  this->declKind = FIELD;
  this->isParam = false;
  this->hasDefaultValue = false;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  iStack_80 = 0x7fffffff;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  local_98._8_8_ = (CapTableReader *)0x0;
  local_98._16_8_ = (WirePointer *)0x0;
  local_98._0_8_ = (SegmentReader *)0x0;
  if (3 < (decl->_reader).pointerCount) {
    local_98._0_8_ = (decl->_reader).segment;
    local_98._8_8_ = (decl->_reader).capTable;
    local_98._16_8_ = (decl->_reader).pointers + 3;
    iStack_80 = (decl->_reader).nestingLimit;
  }
  capnp::_::PointerReader::getList
            (&(this->declAnnotations).reader,(PointerReader *)local_98,INLINE_COMPOSITE,(word *)0x0)
  ;
  uVar2 = (decl->_reader).dataSize;
  if (0x3f < uVar2) {
    uVar12 = *(uint *)((long)(decl->_reader).data + 4);
  }
  this->startByte = uVar12;
  uVar12 = 0;
  if (0x5f < uVar2) {
    uVar12 = *(uint *)((long)(decl->_reader).data + 8);
  }
  this->endByte = uVar12;
  WVar10 = FILE;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = (SegmentBuilder *)0x0;
  (this->node)._builder.capTable = (CapTableBuilder *)0x0;
  (this->node)._builder.data = (void *)0x0;
  (this->node)._builder.pointers = (WirePointer *)0x0;
  (this->sourceInfo)._builder.segment = (SegmentBuilder *)0x0;
  (this->sourceInfo)._builder.capTable = (CapTableBuilder *)0x0;
  (this->sourceInfo)._builder.data = (void *)0x0;
  (this->sourceInfo)._builder.pointers = (WirePointer *)0x0;
  (this->field_21).fieldScope = fieldScope;
  uVar2 = (decl->_reader).dataSize;
  if (0x1f < uVar2) {
    WVar10 = *(Which *)((long)(decl->_reader).data + 2);
  }
  local_98._2_2_ = FIELD;
  local_98._0_2_ = WVar10;
  local_98._8_8_ = " == ";
  local_98._16_8_ = (WirePointer *)0x5;
  iStack_80 = CONCAT31(iStack_80._1_3_,WVar10 == FIELD);
  if (WVar10 == FIELD) {
    local_68 = (decl->_reader).segment;
    local_58 = (decl->_reader).capTable;
    local_60 = (decl->_reader).pointers;
    uVar1 = (decl->_reader).pointerCount;
    iVar13 = (decl->_reader).nestingLimit;
    if (uVar1 < 6) {
      local_50.nestingLimit = 0x7fffffff;
      local_50.capTable = (CapTableReader *)0x0;
      local_50.pointer = (WirePointer *)0x0;
      local_50.segment = (SegmentReader *)0x0;
    }
    else {
      local_50.pointer = local_60 + 5;
      local_50.capTable = local_58;
      local_50.segment = local_68;
      local_50.nestingLimit = iVar13;
    }
    pvVar3 = (decl->_reader).data;
    capnp::_::PointerReader::getStruct((StructReader *)local_98,&local_50,(word *)0x0);
    (this->fieldType)._reader.dataSize = local_78;
    (this->fieldType)._reader.pointerCount = SStack_74;
    *(undefined2 *)&(this->fieldType)._reader.field_0x26 = uStack_72;
    *(ulong *)&(this->fieldType)._reader.nestingLimit = CONCAT44(uStack_6c,iStack_70);
    (this->fieldType)._reader.data = (void *)local_98._16_8_;
    (this->fieldType)._reader.pointers = (WirePointer *)CONCAT44(uStack_7c,iStack_80);
    (this->fieldType)._reader.segment = (SegmentReader *)local_98._0_8_;
    (this->fieldType)._reader.capTable = (CapTableReader *)local_98._8_8_;
    if ((0x6f < uVar2) && (*(short *)((long)pvVar3 + 0xc) == 1)) {
      this->hasDefaultValue = true;
      if (uVar1 < 7) {
        iVar13 = 0x7fffffff;
        local_50.capTable = (CapTableReader *)0x0;
        local_50.pointer = (WirePointer *)0x0;
        local_50.segment = (SegmentReader *)0x0;
      }
      else {
        local_50.pointer = local_60 + 6;
        local_50.capTable = local_58;
        local_50.segment = local_68;
      }
      local_50.nestingLimit = iVar13;
      capnp::_::PointerReader::getStruct((StructReader *)local_98,&local_50,(word *)0x0);
      (this->fieldDefaultValue)._reader.dataSize = local_78;
      (this->fieldDefaultValue)._reader.pointerCount = SStack_74;
      *(undefined2 *)&(this->fieldDefaultValue)._reader.field_0x26 = uStack_72;
      *(ulong *)&(this->fieldDefaultValue)._reader.nestingLimit = CONCAT44(uStack_6c,iStack_70);
      (this->fieldDefaultValue)._reader.data = (void *)local_98._16_8_;
      (this->fieldDefaultValue)._reader.pointers = (WirePointer *)CONCAT44(uStack_7c,iStack_80);
      (this->fieldDefaultValue)._reader.segment = (SegmentReader *)local_98._0_8_;
      (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)local_98._8_8_;
    }
    if ((decl->_reader).pointerCount < 5) {
      local_98._0_8_ = (SegmentReader *)0x0;
      local_98._8_8_ = (CapTableReader *)0x0;
      local_98._16_8_ = (WirePointer *)0x0;
      iStack_80 = 0x7fffffff;
    }
    else {
      local_98._0_8_ = (decl->_reader).segment;
      local_98._8_8_ = (decl->_reader).capTable;
      local_98._16_8_ = (decl->_reader).pointers + 4;
      iStack_80 = (decl->_reader).nestingLimit;
    }
    PVar11 = capnp::_::PointerReader::getPointerType((PointerReader *)local_98);
    if (PVar11 != NULL_) {
      if ((decl->_reader).pointerCount < 5) {
        iStack_80 = 0x7fffffff;
        local_98._8_8_ = (CapTableReader *)0x0;
        local_98._16_8_ = (WirePointer *)0x0;
        local_98._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_98._0_8_ = (decl->_reader).segment;
        local_98._8_8_ = (decl->_reader).capTable;
        local_98._16_8_ = (decl->_reader).pointers + 4;
        iStack_80 = (decl->_reader).nestingLimit;
      }
      AVar14 = (ArrayPtr<const_char>)
               capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_98,(void *)0x0,0);
      if ((this->docComment).ptr.isSet == true) {
        (this->docComment).ptr.isSet = false;
      }
      (this->docComment).ptr.field_1.value.super_StringPtr.content = AVar14;
      (this->docComment).ptr.isSet = true;
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::Declaration::Which,capnp::compiler::Declaration::Which>&>
            ((Fault *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x42f,FAILED,"decl.which() == Declaration::FIELD","_kjCondition,",
             (DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
              *)local_98);
  kj::_::Debug::Fault::fatal((Fault *)&local_50);
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(Declaration::FIELD),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      KJ_REQUIRE(decl.which() == Declaration::FIELD);
      auto fieldDecl = decl.getField();
      fieldType = fieldDecl.getType();
      if (fieldDecl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = fieldDecl.getDefaultValue().getValue();
      }
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }